

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
slice_projection::evaluate
          (slice_projection *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  long lVar1;
  pointer ppeVar2;
  int iVar3;
  pointer ptr;
  reference pbVar4;
  size_t sVar5;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  size_t sVar6;
  pointer phVar7;
  undefined4 extraout_var;
  reference pbVar8;
  undefined4 extraout_var_00;
  uint uVar9;
  pointer phVar10;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  **expression;
  ulong i_00;
  pointer ppeVar11;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  **expression_1;
  size_t sVar12;
  int64_t i;
  long lVar13;
  pointer local_48;
  slice_projection *local_40;
  long local_38;
  
  pbVar4 = val;
  while (uVar9 = *(byte *)&pbVar4->field_0 & 0xf, uVar9 - 8 < 2) {
    pbVar4 = *(reference *)((long)&(pbVar4->field_0).int64_ + 8);
  }
  if (uVar9 == 0xe) {
    sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
    if ((this->slice_).start_.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == true) {
      lVar13 = (this->slice_).start_.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload._M_value;
      i_00 = (lVar13 >> 0x3f & sVar5) + lVar13;
      if ((long)sVar5 <= (long)i_00) {
        i_00 = sVar5;
      }
    }
    else {
      i_00 = (this->slice_).step_ >> 0x3f & sVar5;
    }
    sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
    if ((this->slice_).stop_.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == true) {
      lVar1 = (this->slice_).stop_.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value;
      lVar13 = (this->slice_).step_;
      sVar12 = (lVar1 >> 0x3f & sVar5) + lVar1;
      if ((long)sVar5 <= (long)sVar12) {
        sVar12 = sVar5;
      }
    }
    else {
      lVar13 = (this->slice_).step_;
      sVar12 = 0xffffffffffffffff;
      if (-1 < lVar13) {
        sVar12 = sVar5;
      }
    }
    if (lVar13 != 0) {
      this_00 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                ::create_json<jsoncons::json_array_arg_t_const&>
                          ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                            *)context,(json_array_arg_t *)&json_array_arg);
      local_40 = this;
      local_38 = lVar13;
      if (lVar13 < 1) {
        sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
        if ((long)sVar5 <= (long)i_00) {
          sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
          i_00 = sVar5 - 1;
        }
        sVar5 = 0xffffffffffffffff;
        if (-1 < (long)sVar12) {
          sVar5 = sVar12;
        }
        for (; (long)sVar5 < (long)i_00; i_00 = i_00 + lVar13) {
          phVar7 = (pointer)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                      (val,i_00);
          ppeVar2 = (local_40->super_projection_base).expressions_.
                    super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppeVar11 = (local_40->super_projection_base).expressions_.
                          super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; lVar13 = local_38,
              phVar10 = phVar7, ppeVar11 != ppeVar2; ppeVar11 = ppeVar11 + 1) {
            iVar3 = (*((*ppeVar11)->
                      super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      )._vptr_expr_base[2])(*ppeVar11,phVar7,context,ec);
            phVar7 = (pointer)CONCAT44(extraout_var_00,iVar3);
          }
          while ((*(byte *)&phVar10->
                            super_heap_string_base<jsoncons::null_type,_std::allocator<char>_> & 0xf
                 ) - 8 < 2) {
            phVar10 = (pointer)phVar10->p_;
          }
          if ((*(byte *)&phVar10->super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>
              & 0xf) != 0) {
            local_48 = phVar7;
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                      (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,
                       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                       &local_48);
          }
        }
      }
      else {
        sVar5 = 0;
        if (0 < (long)i_00) {
          sVar5 = i_00;
        }
        sVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
        if ((long)sVar6 < (long)sVar12) {
          sVar12 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
        }
        for (; (long)sVar5 < (long)sVar12; sVar5 = sVar5 + lVar13) {
          phVar7 = (pointer)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                      (val,sVar5);
          ppeVar2 = (local_40->super_projection_base).expressions_.
                    super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppeVar11 = (local_40->super_projection_base).expressions_.
                          super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; lVar13 = local_38,
              phVar10 = phVar7, ppeVar11 != ppeVar2; ppeVar11 = ppeVar11 + 1) {
            iVar3 = (*((*ppeVar11)->
                      super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      )._vptr_expr_base[2])(*ppeVar11,phVar7,context,ec);
            phVar7 = (pointer)CONCAT44(extraout_var,iVar3);
          }
          while ((*(byte *)&phVar10->
                            super_heap_string_base<jsoncons::null_type,_std::allocator<char>_> & 0xf
                 ) - 8 < 2) {
            phVar10 = (pointer)phVar10->p_;
          }
          if ((*(byte *)&phVar10->super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>
              & 0xf) != 0) {
            local_48 = phVar7;
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                      (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,
                       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                       &local_48);
          }
        }
      }
      return (reference)this_00;
    }
    std::error_code::operator=(ec,step_cannot_be_zero);
  }
  pbVar8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar8;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_array())
                {
                    return context.null_value();
                }

                auto start = slice_.get_start(val.size());
                auto end = slice_.get_stop(val.size());
                auto step = slice_.step();

                if (step == 0)
                {
                    ec = jmespath_errc::step_cannot_be_zero;
                    return context.null_value();
                }

                auto result = context.create_json(json_array_arg);
                if (step > 0)
                {
                    if (start < 0)
                    {
                        start = 0;
                    }
                    if (end > static_cast<int64_t>(val.size()))
                    {
                        end = val.size();
                    }
                    for (int64_t i = start; i < end; i += step)
                    {
                        reference j = this->apply_expressions(val.at(static_cast<std::size_t>(i)), context, ec);
                        if (!j.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(j));
                        }
                    }
                }
                else
                {
                    if (start >= static_cast<int64_t>(val.size()))
                    {
                        start = static_cast<int64_t>(val.size()) - 1;
                    }
                    if (end < -1)
                    {
                        end = -1;
                    }
                    for (int64_t i = start; i > end; i += step)
                    {
                        reference j = this->apply_expressions(val.at(static_cast<std::size_t>(i)), context, ec);
                        if (!j.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(j));
                        }
                    }
                }

                return *result;
            }